

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementText.cpp
# Opt level: O0

void __thiscall Rml::ElementText::GetRML(ElementText *this,String *content)

{
  String local_38;
  String *local_18;
  String *content_local;
  ElementText *this_local;
  
  local_18 = content;
  content_local = (String *)this;
  StringUtilities::EncodeRml(&local_38,&this->text);
  ::std::__cxx11::string::operator+=((string *)local_18,(string *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void ElementText::GetRML(String& content)
{
	content += StringUtilities::EncodeRml(text);
}